

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  bool bVar1;
  float power_local;
  void *v_max_local;
  void *v_min_local;
  void *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  switch(data_type) {
  case 0:
    bVar1 = false;
    if (-0x40000001 < *v_min) {
      bVar1 = *v_max < 0x40000000;
    }
    if (!bVar1) {
      __assert_fail("*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x234f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<int,int,float>(bb,id,data_type,(int *)v,*v_min,*v_max,format,power,flags);
    break;
  case 1:
    if (0x7fffffff < *v_min) {
      __assert_fail("*(const ImU32*)v_min <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2352,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_int,int,float>
                   (bb,id,data_type,(uint *)v,*v_min,*v_max,format,power,flags);
    break;
  case 2:
    bVar1 = false;
    if (-0x4000000000000001 < *v_min) {
      bVar1 = *v_max < 0x4000000000000000;
    }
    if (!bVar1) {
      __assert_fail("*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2355,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<long_long,long_long,double>
                   (bb,id,data_type,(longlong *)v,*v_min,*v_max,format,power,flags);
    break;
  case 3:
    if (0x7fffffffffffffff < *v_min) {
      __assert_fail("*(const ImU64*)v_min <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2358,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<unsigned_long_long,long_long,double>
                   (bb,id,data_type,(unsigned_long_long *)v,*v_min,*v_max,format,power,flags);
    break;
  case 4:
    bVar1 = false;
    if (-1.7014117e+38 <= *v_min) {
      bVar1 = *v_max <= 1.7014117e+38;
    }
    if (!bVar1) {
      __assert_fail("*(const float*)v_min >= -3.40282347e+38F/2.0f && *(const float*)v_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235b,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<float,float,float>
                   (bb,id,data_type,(float *)v,*v_min,*v_max,format,power,flags);
    break;
  case 5:
    bVar1 = false;
    if (-8.988465674311579e+307 <= *v_min) {
      bVar1 = *v_max <= 8.988465674311579e+307;
    }
    if (!bVar1) {
      __assert_fail("*(const double*)v_min >= -1.7976931348623157e+308/2.0f && *(const double*)v_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235e,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    bb_local._7_1_ =
         SliderBehaviorT<double,double,double>
                   (bb,id,data_type,(double *)v,*v_min,*v_max,format,power,flags);
    break;
  case 6:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2362,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                 );
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}